

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_gate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *pCVar3;
  CHAR_DATA *in_RDX;
  int in_ESI;
  __type_conflict2 _Var4;
  bool gate_pet;
  CHAR_DATA *victim;
  char *in_stack_00002380;
  CHAR_DATA *in_stack_00002388;
  char *in_stack_00005bd0;
  CHAR_DATA *in_stack_00005bd8;
  CHAR_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *in_stack_ffffffffffffff80;
  CHAR_DATA *in_stack_ffffffffffffff88;
  CHAR_DATA *in_stack_ffffffffffffff90;
  CHAR_DATA *in_stack_ffffffffffffff98;
  ulong uVar5;
  ROOM_INDEX_DATA *pRoomIndex;
  CHAR_DATA *ch_00;
  CHAR_DATA *victim_00;
  ulong in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar6;
  int local_8;
  
  if (in_RDX->fighting != (CHAR_DATA *)0x0) {
    send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    return;
  }
  pCVar3 = get_char_world(in_stack_00002388,in_stack_00002380);
  iVar2 = (int)in_stack_ffffffffffffffc0;
  local_8 = in_ESI;
  if (pCVar3 != (CHAR_DATA *)0x0) {
    bVar1 = is_npc(in_stack_ffffffffffffff78);
    if ((bVar1) &&
       (uVar5 = pCVar3->res_flags[0], _Var4 = std::pow<int,int>(0,0x616aa8),
       (uVar5 & (long)_Var4) != 0)) {
      local_8 = in_ESI + -5;
    }
    bVar1 = is_npc(in_stack_ffffffffffffff78);
    if (bVar1) {
      in_stack_ffffffffffffffc0 = pCVar3->vuln_flags[0];
      _Var4 = std::pow<int,int>(0,0x616af9);
      if ((in_stack_ffffffffffffffc0 & (long)_Var4) != 0) {
        local_8 = local_8 + 5;
      }
    }
    iVar2 = (int)in_stack_ffffffffffffffc0;
  }
  if ((((pCVar3 != (CHAR_DATA *)0x0) && (pCVar3 != in_RDX)) &&
      (pCVar3->in_room != (ROOM_INDEX_DATA *)0x0)) &&
     (bVar1 = can_see_room(in_stack_ffffffffffffff98,(ROOM_INDEX_DATA *)in_stack_ffffffffffffff90),
     bVar1)) {
    victim_00 = (CHAR_DATA *)pCVar3->in_room->room_flags[0];
    _Var4 = std::pow<int,int>(0,0x616b94);
    if (((ulong)victim_00 & (long)_Var4) == 0) {
      ch_00 = (CHAR_DATA *)pCVar3->in_room->room_flags[0];
      _Var4 = std::pow<int,int>(0,0x616bd2);
      if (((ulong)ch_00 & (long)_Var4) == 0) {
        pRoomIndex = (ROOM_INDEX_DATA *)pCVar3->in_room->room_flags[0];
        _Var4 = std::pow<int,int>(0,0x616c10);
        if ((((((ulong)pRoomIndex & (long)_Var4) == 0) && (pCVar3->in_room->area->area_type != 5))
            && ((in_RDX->in_room->guild == 0 && (pCVar3->in_room->guild == 0)))) &&
           (((pCVar3->in_room->cabal == 0 || (pCVar3->in_room->cabal == in_RDX->cabal)) &&
            (uVar5 = pCVar3->in_room->room_flags[0], _Var4 = std::pow<int,int>(0,0x616ce2),
            (uVar5 & (long)_Var4) == 0)))) {
          uVar5 = pCVar3->in_room->room_flags[0];
          _Var4 = std::pow<int,int>(0,0x616d20);
          if ((uVar5 & (long)_Var4) == 0) {
            in_stack_ffffffffffffff90 = (CHAR_DATA *)in_RDX->in_room->room_flags[0];
            _Var4 = std::pow<int,int>(0,0x616d5e);
            if ((((ulong)in_stack_ffffffffffffff90 & (long)_Var4) == 0) &&
               ((int)pCVar3->level < local_8 + 4)) {
              bVar1 = is_npc(in_stack_ffffffffffffff78);
              if ((!bVar1) &&
                 (bVar1 = can_pk(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80), !bVar1)) {
                in_stack_ffffffffffffff88 = (CHAR_DATA *)pCVar3->act[0];
                _Var4 = std::pow<int,int>(0,0x616dd4);
                if (((ulong)in_stack_ffffffffffffff88 & (long)_Var4) != 0) goto LAB_00616efe;
              }
              bVar1 = is_npc(in_stack_ffffffffffffff78);
              if (((bVar1) ||
                  (bVar1 = saves_spell(iVar2,victim_00,(int)((ulong)ch_00 >> 0x20)), !bVar1)) &&
                 ((bVar1 = is_npc(in_stack_ffffffffffffff78), bVar1 || (pCVar3->level < 0x34)))) {
                bVar1 = is_npc(in_stack_ffffffffffffff78);
                if (bVar1) {
                  in_stack_ffffffffffffff80 = (CHAR_DATA *)pCVar3->imm_flags[0];
                  _Var4 = std::pow<int,int>(0,0x616e67);
                  if (((ulong)in_stack_ffffffffffffff80 & (long)_Var4) != 0) goto LAB_00616efe;
                }
                bVar1 = is_npc(in_stack_ffffffffffffff78);
                if (((!bVar1) ||
                    (bVar1 = saves_spell(iVar2,victim_00,(int)((ulong)ch_00 >> 0x20)), !bVar1)) &&
                   (((bVar1 = is_affected_room(in_RDX->in_room,(int)gsn_plasma_cube), !bVar1 ||
                     (iVar2 = number_percent(), 0x31 < iVar2)) &&
                    ((bVar1 = is_affected_room(pCVar3->in_room,(int)gsn_plasma_cube), !bVar1 ||
                     (iVar2 = number_percent(), 0x31 < iVar2)))))) {
                  bVar1 = is_affected(in_RDX,(int)gsn_bind_feet);
                  if (bVar1) {
                    send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
                    return;
                  }
                  if ((pCVar3->in_room->cabal != 0) && (pCVar3->in_room->cabal != pCVar3->cabal)) {
                    send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
                    return;
                  }
                  if ((in_RDX->pet == (CHAR_DATA *)0x0) || (in_RDX->in_room != in_RDX->pet->in_room)
                     ) {
                    bVar6 = 0;
                  }
                  else {
                    bVar6 = 1;
                  }
                  un_blade_barrier(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
                  act((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                      in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
                  send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
                  char_from_room((CHAR_DATA *)CONCAT17(bVar6,in_stack_ffffffffffffffd0));
                  char_to_room(ch_00,pRoomIndex);
                  act((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                      in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
                  do_look(in_stack_00005bd8,in_stack_00005bd0);
                  check_plasma_thread(in_stack_ffffffffffffff90,
                                      (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
                  if ((bVar6 & 1) == 0) {
                    return;
                  }
                  act((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                      in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
                  send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
                  char_from_room((CHAR_DATA *)CONCAT17(bVar6,in_stack_ffffffffffffffd0));
                  char_to_room(ch_00,pRoomIndex);
                  act((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                      in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
                  do_look(in_stack_00005bd8,in_stack_00005bd0);
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00616efe:
  send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void spell_gate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	bool gate_pet;

	if (ch->fighting != nullptr)
	{
		send_to_char("You can't concentrate enough.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, target_name);

	if (!(victim == nullptr))
	{
		if ((is_npc(victim)) && (IS_SET(victim->res_flags, RES_SUMMON)))
			level -= 5;

		if ((is_npc(victim)) && (IS_SET(victim->vuln_flags, VULN_SUMMON)))
			level += 5;
	}

	if (victim == nullptr
		|| victim == ch
		|| victim->in_room == nullptr
		|| !can_see_room(ch, victim->in_room)
		|| IS_SET(victim->in_room->room_flags, ROOM_NO_GATE)
		|| IS_SET(victim->in_room->room_flags, ROOM_SAFE)
		|| IS_SET(victim->in_room->room_flags, ROOM_PRIVATE)
		|| victim->in_room->area->area_type == ARE_UNOPENED
		|| ch->in_room->guild != 0
		|| victim->in_room->guild != 0
		|| (victim->in_room->cabal != 0 && victim->in_room->cabal != ch->cabal)
		|| IS_SET(victim->in_room->room_flags, ROOM_SOLITARY)
		|| IS_SET(victim->in_room->room_flags, ROOM_NO_RECALL)
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_RECALL)
		|| victim->level >= level + 4
		|| (!is_npc(victim) && !can_pk(ch, victim) && IS_SET(victim->act, PLR_NOSUMMON))
		|| (!is_npc(victim) && saves_spell(level, victim, DAM_OTHER))
		|| (!is_npc(victim) && victim->level > LEVEL_HERO) /* NOT trust */
		|| (is_npc(victim) && IS_SET(victim->imm_flags, IMM_SUMMON))
		|| (is_npc(victim) && saves_spell(level, victim, DAM_OTHER))
		|| (is_affected_room(ch->in_room, gsn_plasma_cube) && number_percent() < 50)
		|| (is_affected_room(victim->in_room, gsn_plasma_cube) && number_percent() < 50))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_bind_feet))
	{
		send_to_char("Your feet are rooted to the ground!\n\r", ch);
		return;
	}

	if (victim->in_room->cabal != 0 && victim->in_room->cabal != victim->cabal)
	{
		send_to_char("You failed.\n\r", victim);
		return;
	}

	if (ch->pet != nullptr && ch->in_room == ch->pet->in_room)
		gate_pet = true;
	else
		gate_pet = false;

	un_blade_barrier(ch, nullptr);

	act("$n steps through a gate and vanishes.", ch, nullptr, nullptr, TO_ROOM);

	send_to_char("You step through a gate and vanish.\n\r", ch);
	char_from_room(ch);
	char_to_room(ch, victim->in_room);

	act("$n has arrived through a gate.", ch, nullptr, nullptr, TO_ROOM);
	do_look(ch, "auto");
	check_plasma_thread(ch, -1);

	if (gate_pet)
	{
		act("$n steps through a gate and vanishes.", ch->pet, nullptr, nullptr, TO_ROOM);
		send_to_char("You step through a gate and vanish.\n\r", ch->pet);

		char_from_room(ch->pet);
		char_to_room(ch->pet, victim->in_room);

		act("$n has arrived through a gate.", ch->pet, nullptr, nullptr, TO_ROOM);
		do_look(ch->pet, "auto");
	}
}